

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2780404::
MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
::TearDown(MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
           *this)

{
  if ((this->params_).use_high_bit_depth == true) {
    this->src_ = (uint8_t *)((long)this->src_ * 2);
    this->ref_ = (uint8_t *)((long)this->ref_ * 2);
  }
  aom_free(this->src_);
  if (this->ref_ != (uint8_t *)0x0) {
    operator_delete__(this->ref_);
  }
  this->src_ = (uint8_t *)0x0;
  this->ref_ = (uint8_t *)0x0;
  return;
}

Assistant:

void TearDown() override {
    if (use_high_bit_depth()) {
      // TODO(skal): remove!
      src_ = reinterpret_cast<uint8_t *>(CONVERT_TO_SHORTPTR(src_));
      ref_ = reinterpret_cast<uint8_t *>(CONVERT_TO_SHORTPTR(ref_));
    }

    aom_free(src_);
    delete[] ref_;
    src_ = nullptr;
    ref_ = nullptr;
  }